

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

u8 * dec_bs_get_one_unit(com_bs_t *bs,u8 **next_start)

{
  uint uVar1;
  u8 *puVar2;
  int iVar3;
  u8 *puVar4;
  u8 *puVar5;
  int iVar6;
  int iVar7;
  int iVar9;
  long lVar10;
  ulong uVar11;
  u8 *puVar12;
  int iVar8;
  
  puVar2 = bs->cur;
  puVar5 = bs->end + 1;
  iVar3 = (int)puVar5 - (int)puVar2;
  iVar6 = iVar3 + -4;
  lVar10 = 0;
  iVar9 = 0;
  do {
    if (iVar6 <= iVar9 + 1) {
LAB_00135922:
      if (iVar9 + 1 < iVar6) {
        puVar5 = puVar2 + (iVar3 - lVar10);
      }
      *next_start = puVar5;
      puVar5 = dec_bs_demulate(puVar2 + -1,puVar5);
      return puVar5;
    }
    uVar1 = *(uint *)(puVar2 + (long)iVar9 + 4);
    if ((~(0x1000100 - uVar1 | uVar1) & 0x80008080) != 0) {
      uVar11 = (long)iVar9;
      if (0 < iVar9) {
        uVar11 = (ulong)(iVar9 - (uint)((char)uVar1 == '\0'));
      }
      puVar4 = puVar2 + uVar11 + 4;
      iVar7 = (int)uVar11 + 2;
      do {
        iVar8 = iVar7;
        puVar12 = puVar4;
        iVar7 = iVar8 + 1;
        puVar4 = puVar12 + 1;
      } while (*puVar12 != '\0');
      if (((iVar7 < iVar6) && (puVar12[1] == '\0')) && (puVar12[2] == '\x01')) {
        lVar10 = (long)(((int)bs->end - (int)puVar2) - iVar7);
        goto LAB_00135922;
      }
      iVar9 = iVar8 + -5;
    }
    iVar9 = iVar9 + 5;
  } while( true );
}

Assistant:

u8* dec_bs_get_one_unit(com_bs_t *bs, u8 **next_start)
{
    u8 *start = bs->cur;
    u8 *end   = bs->end + 1;
    int len = (int)(end - start);
    int left_bytes;

    if (dec_bs_find_start_code(start + 4, len - 4, &left_bytes)) {
        end = start + len - left_bytes;
    }

    *next_start = end;

    return dec_bs_demulate(start - 1, end);
}